

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
          (AnimatedShapeSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromObject,Transform *identity,bool reverseOrientation,
          int materialIndex,string *materialName,int lightIndex,string *insideMedium,
          string *outsideMedium)

{
  FileLoc loc_00;
  byte bVar1;
  size_t in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  undefined4 in_stack_00000020;
  string *in_stack_00000028;
  undefined4 in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  ParameterDictionary *in_stack_fffffffffffffef8;
  ParameterDictionary *in_stack_ffffffffffffff00;
  AnimatedTransform *in_stack_ffffffffffffffb8;
  ParameterDictionary *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  ParameterDictionary::ParameterDictionary(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  loc_00.filename._M_str = in_RDX;
  loc_00.filename._M_len = in_RCX;
  loc_00.line = (int)in_RSI;
  loc_00.column = (int)((ulong)in_RSI >> 0x20);
  TransformedSceneEntity::TransformedSceneEntity
            ((TransformedSceneEntity *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,loc_00,in_stack_ffffffffffffffb8);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9e2b22);
  *(undefined8 *)(in_RDI + 0x358) = in_R8;
  *(byte *)(in_RDI + 0x360) = bVar1 & 1;
  *(undefined4 *)(in_RDI + 0x364) = in_stack_00000020;
  std::__cxx11::string::string((string *)(in_RDI + 0x368),in_stack_00000028);
  *(undefined4 *)(in_RDI + 0x388) = in_stack_00000030;
  std::__cxx11::string::string((string *)(in_RDI + 0x390),in_stack_00000038);
  std::__cxx11::string::string((string *)(in_RDI + 0x3b0),in_stack_00000040);
  return;
}

Assistant:

AnimatedShapeSceneEntity(const std::string &name, ParameterDictionary parameters,
                             FileLoc loc, const AnimatedTransform &renderFromObject,
                             const Transform *identity, bool reverseOrientation,
                             int materialIndex, const std::string &materialName,
                             int lightIndex, const std::string &insideMedium,
                             const std::string &outsideMedium)
        : TransformedSceneEntity(name, parameters, loc, renderFromObject),
          identity(identity),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}